

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

string * __thiscall
google::protobuf::Descriptor::DebugString_abi_cxx11_
          (string *__return_storage_ptr__,Descriptor *this)

{
  string *value;
  SubstituteArg local_210;
  SubstituteArg local_1e0;
  SubstituteArg local_1b0;
  SubstituteArg local_180;
  SubstituteArg local_150;
  SubstituteArg local_120;
  SubstituteArg local_f0;
  SubstituteArg local_c0;
  SubstituteArg local_90;
  SubstituteArg local_50;
  undefined1 local_19;
  Descriptor *local_18;
  Descriptor *this_local;
  string *contents;
  
  local_19 = 0;
  local_18 = this;
  this_local = (Descriptor *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  value = name_abi_cxx11_(this);
  strings::internal::SubstituteArg::SubstituteArg(&local_50,value);
  strings::internal::SubstituteArg::SubstituteArg(&local_90);
  strings::internal::SubstituteArg::SubstituteArg(&local_c0);
  strings::internal::SubstituteArg::SubstituteArg(&local_f0);
  strings::internal::SubstituteArg::SubstituteArg(&local_120);
  strings::internal::SubstituteArg::SubstituteArg(&local_150);
  strings::internal::SubstituteArg::SubstituteArg(&local_180);
  strings::internal::SubstituteArg::SubstituteArg(&local_1b0);
  strings::internal::SubstituteArg::SubstituteArg(&local_1e0);
  strings::internal::SubstituteArg::SubstituteArg(&local_210);
  strings::SubstituteAndAppend
            (__return_storage_ptr__,"message $0",&local_50,&local_90,&local_c0,&local_f0,&local_120,
             &local_150,&local_180,&local_1b0,&local_1e0,&local_210);
  DebugString(this,0,__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

string Descriptor::DebugString() const {
  string contents;
  strings::SubstituteAndAppend(&contents, "message $0", name());
  DebugString(0, &contents);
  return contents;
}